

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

int nifti_intent_code(char *name)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *__dest;
  __int32_t **pp_Var4;
  char cVar5;
  long lVar6;
  
  iVar2 = -1;
  if ((name != (char *)0x0) && (*name != '\0')) {
    sVar3 = strlen(name);
    __dest = (char *)malloc(sVar3 + 1);
    strcpy(__dest,name);
    cVar5 = *__dest;
    if (cVar5 != '\0') {
      pp_Var4 = __ctype_toupper_loc();
      pcVar1 = __dest;
      do {
        *pcVar1 = (char)(*pp_Var4)[cVar5];
        cVar5 = pcVar1[1];
        pcVar1 = pcVar1 + 1;
      } while (cVar5 != '\0');
    }
    lVar6 = 2;
    do {
      iVar2 = strcmp(inam[lVar6],__dest);
      if (iVar2 == 0) goto LAB_0010ff19;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x19);
    lVar6 = 0xffffffff;
LAB_0010ff19:
    iVar2 = (int)lVar6;
    free(__dest);
  }
  return iVar2;
}

Assistant:

int nifti_intent_code( char *name )
{
   char *unam , *upt ;
   int ii ;

   if( name == NULL || *name == '\0' ) return -1 ;

   unam = (char *)malloc(strlen(name)+1);
   strcpy(unam,name);
   for( upt=unam ; *upt != '\0' ; upt++ ) *upt = (char)toupper(*upt) ;

   for( ii=NIFTI_FIRST_STATCODE ; ii <= NIFTI_LAST_STATCODE ; ii++ )
     if( strcmp(inam[ii],unam) == 0 ) break ;

   free(unam) ;
   return (ii <= NIFTI_LAST_STATCODE) ? ii : -1 ;
}